

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

int __thiscall
kratos::SequentialStmtBlock::clone
          (SequentialStmtBlock *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  element_type *peVar1;
  element_type *block;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> local_40;
  undefined1 local_28 [8];
  shared_ptr<kratos::SequentialStmtBlock> stmt;
  SequentialStmtBlock *this_local;
  
  stmt.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  std::make_shared<kratos::SequentialStmtBlock>();
  std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::vector
            (&local_40,
             (vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *)(__fn + 0xe0));
  peVar1 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::operator=
            (&peVar1->conditions_,&local_40);
  std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::~vector(&local_40);
  block = std::__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                    ((__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                     local_28);
  StmtBlock::clone_block((StmtBlock *)__fn,&block->super_StmtBlock);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::SequentialStmtBlock,void>
            ((shared_ptr<kratos::Stmt> *)this,(shared_ptr<kratos::SequentialStmtBlock> *)local_28);
  std::shared_ptr<kratos::SequentialStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::SequentialStmtBlock> *)local_28);
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> SequentialStmtBlock::clone() const {
    auto stmt = std::make_shared<SequentialStmtBlock>();
    stmt->conditions_ = std::vector(conditions_);
    clone_block(stmt.get());
    return stmt;
}